

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O0

int __thiscall
cs_impl::any::clone(any *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  error *this_00;
  proxy *ppVar1;
  proxy *dat;
  string *in_stack_ffffffffffffff88;
  any *in_stack_ffffffffffffff90;
  int *in_stack_ffffffffffffff98;
  allocator *paVar2;
  allocator local_29;
  string local_28 [32];
  any *local_8;
  
  if (this->mDat != (proxy *)0x0) {
    local_8 = this;
    if (2 < this->mDat->protect_level) {
      this_00 = (error *)__cxa_allocate_exception(0x28);
      paVar2 = &local_29;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_28,"E000L",paVar2);
      cov::error::error(this_00,in_stack_ffffffffffffff88);
      __cxa_throw(this_00,&cov::error::typeinfo,cov::error::~error);
    }
    (*this->mDat->data->_vptr_baseHolder[3])();
    ppVar1 = cs::allocator_type<cs_impl::any::proxy,512ul,cs_impl::default_allocator_provider>::
             alloc<int,cs_impl::any::baseHolder*>
                       ((allocator_type<cs_impl::any::proxy,_512UL,_cs_impl::default_allocator_provider>
                         *)this,in_stack_ffffffffffffff98,(baseHolder **)in_stack_ffffffffffffff90);
    recycle(in_stack_ffffffffffffff90);
    ((allocator_type<cs_impl::any::proxy,_512UL,_cs_impl::default_allocator_provider> *)this)->mPool
    [0] = ppVar1;
  }
  return (int)this;
}

Assistant:

void clone()
		{
			if (mDat != nullptr) {
				if (mDat->protect_level > 2)
					throw cov::error("E000L");
				proxy *dat = allocator.alloc(1, mDat->data->duplicate());
				recycle();
				mDat = dat;
			}
		}